

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O3

void __thiscall
dap::BasicTypeInfo<dap::ModuleEvent>::destruct(BasicTypeInfo<dap::ModuleEvent> *this,void *ptr)

{
  if (*(long **)((long)ptr + 0x150) != (long *)((long)ptr + 0x160)) {
    operator_delete(*(long **)((long)ptr + 0x150),*(long *)((long)ptr + 0x160) + 1);
  }
  Module::~Module((Module *)ptr);
  return;
}

Assistant:

inline void destruct(void* ptr) const override {
    reinterpret_cast<T*>(ptr)->~T();
  }